

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadMemLocation
          (BinaryReader *this,Address *alignment_log2,Index *memidx,Address *offset,char *desc_align
          ,char *desc_memidx,char *desc_offset,uint8_t *lane_val)

{
  ulong uVar1;
  Result RVar2;
  Enum EVar3;
  uint32_t val;
  
  RVar2 = ReadAlignment(this,alignment_log2,desc_align);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    uVar1 = *alignment_log2;
    *alignment_log2 = uVar1 & 0xffffffffffffffbf;
    RVar2 = CheckAlignment(this,alignment_log2,desc_align);
    if (RVar2.enum_ == Error) {
      EVar3 = Error;
    }
    else {
      *memidx = 0;
      EVar3 = Error;
      if ((uVar1 & 0x40) != 0) {
        if ((this->options_->features).multi_memory_enabled_ == false) {
          PrintError(this,"multi_memory not allowed");
          return (Result)Error;
        }
        RVar2 = ReadMemidx(this,memidx,desc_memidx);
        if (RVar2.enum_ == Error) {
          return (Result)Error;
        }
      }
      if ((this->options_->features).memory64_enabled_ == true) {
        RVar2 = ReadU64Leb128(this,offset,desc_offset);
      }
      else {
        RVar2 = ReadU32Leb128(this,&val,desc_offset);
        *offset = (ulong)val;
      }
      if ((RVar2.enum_ != Error) &&
         ((lane_val == (uint8_t *)0x0 ||
          (RVar2 = ReadU8(this,lane_val,"Lane idx"), RVar2.enum_ != Error)))) {
        EVar3 = Ok;
      }
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReader::ReadMemLocation(Address* alignment_log2,
                                     Index* memidx,
                                     Address* offset,
                                     const char* desc_align,
                                     const char* desc_memidx,
                                     const char* desc_offset,
                                     uint8_t* lane_val) {
  bool has_memidx = false;
  CHECK_RESULT(ReadAlignment(alignment_log2, desc_align));
  CHECK_RESULT(TakeHasMemidx(alignment_log2, &has_memidx));
  CHECK_RESULT(CheckAlignment(alignment_log2, desc_align));
  *memidx = 0;
  if (has_memidx) {
    ERROR_IF(!options_.features.multi_memory_enabled(),
             "multi_memory not allowed");
    CHECK_RESULT(ReadMemidx(memidx, desc_memidx));
  }
  CHECK_RESULT(ReadAddress(offset, 0, desc_offset));

  if (lane_val) {
    CHECK_RESULT(ReadU8(lane_val, "Lane idx"));
  }

  return Result::Ok;
}